

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::MinMaxState<double>,double,duckdb::MinOperation>
               (double *idata,AggregateInputData *aggr_input_data,MinMaxState<double> **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  MinMaxState<double> *pMVar3;
  MinMaxState<double> **ppMVar4;
  ulong uVar5;
  bool bVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  double local_70;
  ulong local_68;
  MinMaxState<double> **local_60;
  idx_t local_58;
  ulong local_50;
  double *local_48;
  ValidityMask *local_40;
  double *local_38;
  
  local_60 = states;
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar10 = 0;
      do {
        pMVar3 = local_60[iVar10];
        local_70 = idata[iVar10];
        if (pMVar3->isset == false) {
          pMVar3->value = local_70;
          pMVar3->isset = true;
        }
        else {
          bVar6 = GreaterThan::Operation<double>(&pMVar3->value,&local_70);
          if (bVar6) {
            pMVar3->value = local_70;
          }
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_68 = 0;
    uVar9 = 0;
    local_58 = count;
    local_48 = idata;
    do {
      ppMVar4 = local_60;
      puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar11 = count;
        }
LAB_007c6359:
        uVar5 = uVar9;
        if (uVar9 < uVar11) {
          do {
            pMVar3 = ppMVar4[uVar9];
            local_70 = idata[uVar9];
            if (pMVar3->isset == false) {
              pMVar3->value = local_70;
              pMVar3->isset = true;
            }
            else {
              bVar6 = GreaterThan::Operation<double>(&pMVar3->value,&local_70);
              if (bVar6) {
                pMVar3->value = local_70;
              }
            }
            uVar9 = uVar9 + 1;
            uVar5 = uVar11;
          } while (uVar11 != uVar9);
        }
      }
      else {
        uVar2 = puVar1[local_68];
        uVar11 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar11 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_007c6359;
        uVar5 = uVar11;
        if ((uVar2 != 0) && (uVar5 = uVar9, count = local_58, uVar9 < uVar11)) {
          pdVar7 = idata + uVar9;
          uVar8 = 0;
          local_38 = pdVar7;
          do {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              pMVar3 = ppMVar4[uVar9 + uVar8];
              local_70 = pdVar7[uVar8];
              if (pMVar3->isset == false) {
                pMVar3->value = local_70;
                pMVar3->isset = true;
              }
              else {
                bVar6 = GreaterThan::Operation<double>(&pMVar3->value,&local_70);
                pdVar7 = local_38;
                idata = local_48;
                if (bVar6) {
                  pMVar3->value = local_70;
                }
              }
            }
            uVar8 = uVar8 + 1;
            uVar5 = uVar11;
            count = local_58;
          } while (uVar11 - uVar9 != uVar8);
        }
      }
      uVar9 = uVar5;
      local_68 = local_68 + 1;
    } while (local_68 != local_50);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}